

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Promise.h
# Opt level: O2

void __thiscall
async_simple::Promise<async_simple::Unit>::~Promise(Promise<async_simple::Unit> *this)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_char> *paVar2;
  FutureState<async_simple::Unit> *pFVar3;
  runtime_error *this_00;
  
  pFVar3 = this->_sharedState;
  if (pFVar3 != (FutureState<async_simple::Unit> *)0x0) {
    LOCK();
    paVar1 = &pFVar3->_promiseRef;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if (((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) &&
       (((pFVar3->_state)._M_i & (DONE|ONLY_RESULT)) == START)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Promise is broken");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    LOCK();
    paVar2 = &pFVar3->_attached;
    (paVar2->super___atomic_base<unsigned_char>)._M_i =
         (paVar2->super___atomic_base<unsigned_char>)._M_i + 0xff;
    UNLOCK();
    if ((paVar2->super___atomic_base<unsigned_char>)._M_i == '\0') {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_async_simple::Unit,_std::__exception_ptr::exception_ptr>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_async_simple::Unit,_std::__exception_ptr::exception_ptr>
                           *)&pFVar3->_try_value);
      operator_delete(pFVar3,0x58);
    }
  }
  return;
}

Assistant:

~Promise() {
        if (_sharedState) {
            _sharedState->detachPromise();
        }
    }